

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Logger::Logger(Logger *this,string *id,LogStreamsReferenceMap *logStreamsReference)

{
  undefined8 in_RDX;
  Logger *in_RSI;
  undefined8 *in_RDI;
  Configurations *in_stack_ffffffffffffffa0;
  
  el::base::threading::ThreadSafe::ThreadSafe((ThreadSafe *)0x227452);
  Loggable::Loggable((Loggable *)(in_RDI + 2));
  *in_RDI = &PTR_acquireLock_00299580;
  in_RDI[2] = &PTR__Logger_002995c0;
  std::__cxx11::string::string((string *)(in_RDI + 3),(string *)in_RSI);
  in_RDI[7] = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x39));
  *(undefined1 *)(in_RDI + 0x3d) = 0;
  Configurations::Configurations(in_stack_ffffffffffffffa0);
  el::base::utils::std::
  unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::unordered_map((unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                   *)0x2274f7);
  in_RDI[0x4f] = in_RDX;
  el::base::utils::std::shared_ptr<el::LogBuilder>::shared_ptr
            ((shared_ptr<el::LogBuilder> *)0x227519);
  initUnflushedCount(in_RSI);
  return;
}

Assistant:

Logger::Logger(const std::string& id, base::LogStreamsReferenceMap* logStreamsReference) :
  m_id(id),
  m_typedConfigurations(nullptr),
  m_parentApplicationName(std::string()),
  m_isConfigured(false),
  m_logStreamsReference(logStreamsReference) {
  initUnflushedCount();
}